

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void btreeReleaseAllCursorPages(BtCursor *pCur)

{
  long lVar1;
  
  if (-1 < pCur->iPage) {
    lVar1 = -1;
    do {
      if (pCur->apPage[lVar1 + 1] != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(pCur->apPage[lVar1 + 1]->pDbPage);
      }
      pCur->apPage[lVar1 + 1] = (MemPage *)0x0;
      lVar1 = lVar1 + 1;
    } while (lVar1 < pCur->iPage);
  }
  pCur->iPage = -1;
  return;
}

Assistant:

static void btreeReleaseAllCursorPages(BtCursor *pCur){
  int i;
  for(i=0; i<=pCur->iPage; i++){
    releasePage(pCur->apPage[i]);
    pCur->apPage[i] = 0;
  }
  pCur->iPage = -1;
}